

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chainparams.cpp
# Opt level: O3

void __thiscall SigNetParams::SigNetParams(SigNetParams *this,SigNetOptions *options)

{
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  uint256 *puVar1;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *obj;
  CBlock *this_01;
  undefined8 uVar2;
  long lVar3;
  pointer puVar4;
  pointer puVar5;
  undefined1 *puVar6;
  void *pvVar7;
  base_blob<256U> *pbVar8;
  uchar *puVar9;
  pointer puVar10;
  long lVar11;
  ulong uVar12;
  undefined8 *puVar13;
  CBlock *pCVar14;
  CAmount *in_R9;
  long in_FS_OFFSET;
  byte bVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  Span<const_unsigned_char> s;
  string_view source_file;
  string_view logging_function;
  undefined8 local_170;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_168;
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  local_148;
  undefined1 local_128 [32];
  uchar auStack_108 [8];
  uchar local_100 [40];
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  local_d8;
  bool local_c0;
  bool bStack_bf;
  bool local_be;
  uint256 hash;
  HashWriter h;
  
  bVar15 = 0;
  lVar3 = *(long *)(in_FS_OFFSET + 0x28);
  CChainParams::CChainParams(&this->super_CChainParams);
  local_168.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (uchar *)0x0;
  local_168.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_168.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this_00 = &(this->super_CChainParams).vSeeds;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_erase_at_end(this_00,(this->super_CChainParams).vSeeds.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start);
  if ((options->challenge).
      super__Optional_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_false,_false>
      ._M_payload.
      super__Optional_payload<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_true,_false,_false>
      .super__Optional_payload_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>.
      _M_engaged == false) {
    std::vector<unsigned_char,std::allocator<unsigned_char>>::vector<unsigned_char_const*,void>
              ((vector<unsigned_char,std::allocator<unsigned_char>> *)local_128,
               util::hex_literals::detail::Hex<143ul>{std::array<std::byte_71ul>,"",
               (allocator_type *)&h);
    puVar9 = (uchar *)CONCAT17(local_128[7],
                               CONCAT16(local_128[6],
                                        CONCAT15(local_128[5],
                                                 CONCAT14(local_128[4],
                                                          CONCAT13(local_128[3],
                                                                   CONCAT12(local_128[2],
                                                                            CONCAT11(local_128[1],
                                                                                     local_128[0])))
                                                         ))));
    local_168.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish =
         (pointer)CONCAT17(local_128[0xf],
                           CONCAT16(local_128[0xe],
                                    CONCAT15(local_128[0xd],
                                             CONCAT14(local_128[0xc],
                                                      CONCAT13(local_128[0xb],
                                                               CONCAT12(local_128[10],
                                                                        CONCAT11(local_128[9],
                                                                                 local_128[8])))))))
    ;
    puVar4 = (pointer)CONCAT17(local_128[0x17],
                               CONCAT16(local_128[0x16],
                                        CONCAT15(local_128[0x15],
                                                 CONCAT14(local_128[0x14],
                                                          CONCAT13(local_128[0x13],
                                                                   CONCAT12(local_128[0x12],
                                                                            CONCAT11(local_128[0x11]
                                                                                     ,local_128[0x10
                                                  ])))))));
    local_128[0] = (vector<unsigned_char,std::allocator<unsigned_char>>)0x0;
    local_128[1] = '\0';
    local_128[2] = '\0';
    local_128[3] = '\0';
    local_128[4] = '\0';
    local_128[5] = '\0';
    local_128[6] = '\0';
    local_128[7] = '\0';
    local_128[8] = '\0';
    local_128[9] = '\0';
    local_128[10] = '\0';
    local_128[0xb] = '\0';
    local_128[0xc] = '\0';
    local_128[0xd] = '\0';
    local_128[0xe] = '\0';
    local_128[0xf] = '\0';
    local_128[0x10] = '\0';
    local_128[0x11] = '\0';
    local_128[0x12] = '\0';
    local_128[0x13] = '\0';
    local_128[0x14] = '\0';
    local_128[0x15] = '\0';
    local_128[0x16] = '\0';
    local_128[0x17] = '\0';
    if (local_168.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (uchar *)0x0) {
      uVar12 = (long)local_168.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage -
               (long)local_168.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_start;
      local_168.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = puVar4;
      operator_delete(local_168.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start,uVar12);
      local_168.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = puVar9;
      pvVar7 = (void *)CONCAT17(local_128[7],
                                CONCAT16(local_128[6],
                                         CONCAT15(local_128[5],
                                                  CONCAT14(local_128[4],
                                                           CONCAT13(local_128[3],
                                                                    CONCAT12(local_128[2],
                                                                             CONCAT11(local_128[1],
                                                                                      local_128[0]))
                                                                   )))));
      puVar9 = local_168.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start;
      puVar4 = local_168.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
      if (pvVar7 != (void *)0x0) {
        operator_delete(pvVar7,CONCAT17(local_128[0x17],
                                        CONCAT16(local_128[0x16],
                                                 CONCAT15(local_128[0x15],
                                                          CONCAT14(local_128[0x14],
                                                                   CONCAT13(local_128[0x13],
                                                                            CONCAT12(local_128[0x12]
                                                                                     ,CONCAT11(
                                                  local_128[0x11],local_128[0x10]))))))) -
                               (long)pvVar7);
        puVar9 = local_168.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                 .super__Vector_impl_data._M_start;
        puVar4 = local_168.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                 .super__Vector_impl_data._M_end_of_storage;
      }
    }
    local_168.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = puVar4;
    local_168.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = puVar9;
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<char_const(&)[34]>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this_00,
               (char (*) [34])"seed.signet.bitcoin.sprovoost.nl.");
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<char_const(&)[28]>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this_00,
               (char (*) [28])"seed.signet.achownodes.xyz.");
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<char_const(&)[16]>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this_00,
               (char (*) [16])"178.128.221.177");
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<char_const(&)[69]>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this_00,
               (char (*) [69])"v7ajjeirttkbnt32wpy3c6w3emwnfr3fkla7hpxcfokr3ysd3kqtzmqd.onion:38333"
              );
    puVar1 = &(this->super_CChainParams).consensus.nMinimumChainWork;
    (puVar1->super_base_blob<256U>).m_data._M_elems[0] = 0x8f;
    (puVar1->super_base_blob<256U>).m_data._M_elems[1] = 0xe5;
    (puVar1->super_base_blob<256U>).m_data._M_elems[2] = 'f';
    (puVar1->super_base_blob<256U>).m_data._M_elems[3] = 0xbd;
    pbVar8 = &(this->super_CChainParams).consensus.nMinimumChainWork.super_base_blob<256U>;
    (pbVar8->m_data)._M_elems[4] = ']';
    (pbVar8->m_data)._M_elems[5] = '\x02';
    pbVar8 = &(this->super_CChainParams).consensus.nMinimumChainWork.super_base_blob<256U>;
    (pbVar8->m_data)._M_elems[6] = '\0';
    (pbVar8->m_data)._M_elems[7] = '\0';
    (pbVar8->m_data)._M_elems[8] = '\0';
    (pbVar8->m_data)._M_elems[9] = '\0';
    (pbVar8->m_data)._M_elems[10] = '\0';
    (pbVar8->m_data)._M_elems[0xb] = '\0';
    (pbVar8->m_data)._M_elems[0xc] = '\0';
    (pbVar8->m_data)._M_elems[0xd] = '\0';
    pbVar8 = &(this->super_CChainParams).consensus.nMinimumChainWork.super_base_blob<256U>;
    (pbVar8->m_data)._M_elems[0xe] = '\0';
    (pbVar8->m_data)._M_elems[0xf] = '\0';
    (pbVar8->m_data)._M_elems[0x10] = '\0';
    (pbVar8->m_data)._M_elems[0x11] = '\0';
    (pbVar8->m_data)._M_elems[0x12] = '\0';
    (pbVar8->m_data)._M_elems[0x13] = '\0';
    (pbVar8->m_data)._M_elems[0x14] = '\0';
    (pbVar8->m_data)._M_elems[0x15] = '\0';
    pbVar8 = &(this->super_CChainParams).consensus.nMinimumChainWork.super_base_blob<256U>;
    (pbVar8->m_data)._M_elems[0x10] = '\0';
    (pbVar8->m_data)._M_elems[0x11] = '\0';
    (pbVar8->m_data)._M_elems[0x12] = '\0';
    (pbVar8->m_data)._M_elems[0x13] = '\0';
    (pbVar8->m_data)._M_elems[0x14] = '\0';
    (pbVar8->m_data)._M_elems[0x15] = '\0';
    (pbVar8->m_data)._M_elems[0x16] = '\0';
    (pbVar8->m_data)._M_elems[0x17] = '\0';
    pbVar8 = &(this->super_CChainParams).consensus.nMinimumChainWork.super_base_blob<256U>;
    (pbVar8->m_data)._M_elems[0x18] = '\0';
    (pbVar8->m_data)._M_elems[0x19] = '\0';
    (pbVar8->m_data)._M_elems[0x1a] = '\0';
    (pbVar8->m_data)._M_elems[0x1b] = '\0';
    (pbVar8->m_data)._M_elems[0x1c] = '\0';
    (pbVar8->m_data)._M_elems[0x1d] = '\0';
    (pbVar8->m_data)._M_elems[0x1e] = '\0';
    (pbVar8->m_data)._M_elems[0x1f] = '\0';
    puVar1 = &(this->super_CChainParams).consensus.defaultAssumeValid;
    (puVar1->super_base_blob<256U>).m_data._M_elems[0] = '9';
    (puVar1->super_base_blob<256U>).m_data._M_elems[1] = 'E';
    (puVar1->super_base_blob<256U>).m_data._M_elems[2] = 'A';
    (puVar1->super_base_blob<256U>).m_data._M_elems[3] = 0x8d;
    (puVar1->super_base_blob<256U>).m_data._M_elems[4] = 0xe6;
    (puVar1->super_base_blob<256U>).m_data._M_elems[5] = 0xef;
    (puVar1->super_base_blob<256U>).m_data._M_elems[6] = 0xa2;
    (puVar1->super_base_blob<256U>).m_data._M_elems[7] = 's';
    pbVar8 = &(this->super_CChainParams).consensus.defaultAssumeValid.super_base_blob<256U>;
    (pbVar8->m_data)._M_elems[8] = 0xf5;
    (pbVar8->m_data)._M_elems[9] = '\"';
    (pbVar8->m_data)._M_elems[10] = 'k';
    (pbVar8->m_data)._M_elems[0xb] = 'q';
    (pbVar8->m_data)._M_elems[0xc] = 'n';
    (pbVar8->m_data)._M_elems[0xd] = '0';
    (pbVar8->m_data)._M_elems[0xe] = 0xc6;
    (pbVar8->m_data)._M_elems[0xf] = 't';
    pbVar8 = &(this->super_CChainParams).consensus.defaultAssumeValid.super_base_blob<256U>;
    (pbVar8->m_data)._M_elems[0x10] = '3';
    (pbVar8->m_data)._M_elems[0x11] = '\a';
    (pbVar8->m_data)._M_elems[0x12] = 0x9b;
    (pbVar8->m_data)._M_elems[0x13] = 't';
    (pbVar8->m_data)._M_elems[0x14] = 0xdd;
    (pbVar8->m_data)._M_elems[0x15] = 'd';
    (pbVar8->m_data)._M_elems[0x16] = 0xb9;
    (pbVar8->m_data)._M_elems[0x17] = 0xdc;
    pbVar8 = &(this->super_CChainParams).consensus.defaultAssumeValid.super_base_blob<256U>;
    (pbVar8->m_data)._M_elems[0x18] = 0xdd;
    (pbVar8->m_data)._M_elems[0x19] = 'X';
    (pbVar8->m_data)._M_elems[0x1a] = '\x1d';
    (pbVar8->m_data)._M_elems[0x1b] = 0xad;
    (pbVar8->m_data)._M_elems[0x1c] = 'J';
    (pbVar8->m_data)._M_elems[0x1d] = '\x01';
    (pbVar8->m_data)._M_elems[0x1e] = '\0';
    (pbVar8->m_data)._M_elems[0x1f] = '\0';
    (this->super_CChainParams).m_assumed_blockchain_size = 2;
    (this->super_CChainParams).m_assumed_chain_state_size = 0;
    (this->super_CChainParams).chainTxData.nTime = 0x66bce441;
    (this->super_CChainParams).chainTxData.tx_count = 0x5407e5;
    (this->super_CChainParams).chainTxData.dTxRate = 0.06271073277261494;
  }
  else {
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
              (&local_168,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)options);
    pbVar8 = &(this->super_CChainParams).consensus.nMinimumChainWork.super_base_blob<256U>;
    (pbVar8->m_data)._M_elems[0x10] = '\0';
    (pbVar8->m_data)._M_elems[0x11] = '\0';
    (pbVar8->m_data)._M_elems[0x12] = '\0';
    (pbVar8->m_data)._M_elems[0x13] = '\0';
    (pbVar8->m_data)._M_elems[0x14] = '\0';
    (pbVar8->m_data)._M_elems[0x15] = '\0';
    (pbVar8->m_data)._M_elems[0x16] = '\0';
    (pbVar8->m_data)._M_elems[0x17] = '\0';
    pbVar8 = &(this->super_CChainParams).consensus.nMinimumChainWork.super_base_blob<256U>;
    (pbVar8->m_data)._M_elems[0x18] = '\0';
    (pbVar8->m_data)._M_elems[0x19] = '\0';
    (pbVar8->m_data)._M_elems[0x1a] = '\0';
    (pbVar8->m_data)._M_elems[0x1b] = '\0';
    (pbVar8->m_data)._M_elems[0x1c] = '\0';
    (pbVar8->m_data)._M_elems[0x1d] = '\0';
    (pbVar8->m_data)._M_elems[0x1e] = '\0';
    (pbVar8->m_data)._M_elems[0x1f] = '\0';
    puVar1 = &(this->super_CChainParams).consensus.nMinimumChainWork;
    (puVar1->super_base_blob<256U>).m_data._M_elems[0] = '\0';
    (puVar1->super_base_blob<256U>).m_data._M_elems[1] = '\0';
    (puVar1->super_base_blob<256U>).m_data._M_elems[2] = '\0';
    (puVar1->super_base_blob<256U>).m_data._M_elems[3] = '\0';
    (puVar1->super_base_blob<256U>).m_data._M_elems[4] = '\0';
    (puVar1->super_base_blob<256U>).m_data._M_elems[5] = '\0';
    (puVar1->super_base_blob<256U>).m_data._M_elems[6] = '\0';
    (puVar1->super_base_blob<256U>).m_data._M_elems[7] = '\0';
    pbVar8 = &(this->super_CChainParams).consensus.nMinimumChainWork.super_base_blob<256U>;
    (pbVar8->m_data)._M_elems[8] = '\0';
    (pbVar8->m_data)._M_elems[9] = '\0';
    (pbVar8->m_data)._M_elems[10] = '\0';
    (pbVar8->m_data)._M_elems[0xb] = '\0';
    (pbVar8->m_data)._M_elems[0xc] = '\0';
    (pbVar8->m_data)._M_elems[0xd] = '\0';
    (pbVar8->m_data)._M_elems[0xe] = '\0';
    (pbVar8->m_data)._M_elems[0xf] = '\0';
    puVar1 = &(this->super_CChainParams).consensus.defaultAssumeValid;
    (puVar1->super_base_blob<256U>).m_data._M_elems[0] = '\0';
    (puVar1->super_base_blob<256U>).m_data._M_elems[1] = '\0';
    (puVar1->super_base_blob<256U>).m_data._M_elems[2] = '\0';
    (puVar1->super_base_blob<256U>).m_data._M_elems[3] = '\0';
    (puVar1->super_base_blob<256U>).m_data._M_elems[4] = '\0';
    (puVar1->super_base_blob<256U>).m_data._M_elems[5] = '\0';
    (puVar1->super_base_blob<256U>).m_data._M_elems[6] = '\0';
    (puVar1->super_base_blob<256U>).m_data._M_elems[7] = '\0';
    pbVar8 = &(this->super_CChainParams).consensus.defaultAssumeValid.super_base_blob<256U>;
    (pbVar8->m_data)._M_elems[8] = '\0';
    (pbVar8->m_data)._M_elems[9] = '\0';
    (pbVar8->m_data)._M_elems[10] = '\0';
    (pbVar8->m_data)._M_elems[0xb] = '\0';
    (pbVar8->m_data)._M_elems[0xc] = '\0';
    (pbVar8->m_data)._M_elems[0xd] = '\0';
    (pbVar8->m_data)._M_elems[0xe] = '\0';
    (pbVar8->m_data)._M_elems[0xf] = '\0';
    pbVar8 = &(this->super_CChainParams).consensus.defaultAssumeValid.super_base_blob<256U>;
    (pbVar8->m_data)._M_elems[0x10] = '\0';
    (pbVar8->m_data)._M_elems[0x11] = '\0';
    (pbVar8->m_data)._M_elems[0x12] = '\0';
    (pbVar8->m_data)._M_elems[0x13] = '\0';
    (pbVar8->m_data)._M_elems[0x14] = '\0';
    (pbVar8->m_data)._M_elems[0x15] = '\0';
    (pbVar8->m_data)._M_elems[0x16] = '\0';
    (pbVar8->m_data)._M_elems[0x17] = '\0';
    pbVar8 = &(this->super_CChainParams).consensus.defaultAssumeValid.super_base_blob<256U>;
    (pbVar8->m_data)._M_elems[0x18] = '\0';
    (pbVar8->m_data)._M_elems[0x19] = '\0';
    (pbVar8->m_data)._M_elems[0x1a] = '\0';
    (pbVar8->m_data)._M_elems[0x1b] = '\0';
    (pbVar8->m_data)._M_elems[0x1c] = '\0';
    (pbVar8->m_data)._M_elems[0x1d] = '\0';
    (pbVar8->m_data)._M_elems[0x1e] = '\0';
    (pbVar8->m_data)._M_elems[0x1f] = '\0';
    (this->super_CChainParams).m_assumed_blockchain_size = 0;
    (this->super_CChainParams).m_assumed_chain_state_size = 0;
    (this->super_CChainParams).chainTxData.nTime = 0;
    (this->super_CChainParams).chainTxData.tx_count = 0;
    (this->super_CChainParams).chainTxData.dTxRate = 0.0;
    s.m_size = (long)local_168.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_finish -
               (long)local_168.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_start;
    s.m_data = local_168.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start;
    HexStr_abi_cxx11_((string *)local_128,s);
    in_R9 = (CAmount *)0xffffffffffffffff;
    source_file._M_str =
         "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/kernel/chainparams.cpp"
    ;
    source_file._M_len = 0x66;
    logging_function._M_str = "SigNetParams";
    logging_function._M_len = 0xc;
    LogPrintFormatInternal<std::__cxx11::string>
              (logging_function,source_file,0x1be,ALL,Info,(ConstevalFormatString<1U>)0x1105eeb,
               (string *)local_128);
    puVar6 = (undefined1 *)
             CONCAT17(local_128[7],
                      CONCAT16(local_128[6],
                               CONCAT15(local_128[5],
                                        CONCAT14(local_128[4],
                                                 CONCAT13(local_128[3],
                                                          CONCAT12(local_128[2],
                                                                   CONCAT11(local_128[1],
                                                                            local_128[0])))))));
    if (puVar6 != local_128 + 0x10) {
      operator_delete(puVar6,CONCAT17(local_128[0x17],
                                      CONCAT16(local_128[0x16],
                                               CONCAT15(local_128[0x15],
                                                        CONCAT14(local_128[0x14],
                                                                 CONCAT13(local_128[0x13],
                                                                          CONCAT12(local_128[0x12],
                                                                                   CONCAT11(
                                                  local_128[0x11],local_128[0x10]))))))) + 1);
    }
  }
  if ((options->seeds).
      super__Optional_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_false,_false>
      ._M_payload.
      super__Optional_payload<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_true,_false,_false>
      .
      super__Optional_payload_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ._M_engaged == true) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator=(this_00,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)&options->seeds);
  }
  (this->super_CChainParams).m_chain_type = SIGNET;
  (this->super_CChainParams).consensus.signet_blocks = true;
  obj = &(this->super_CChainParams).consensus.signet_challenge;
  std::vector<unsigned_char,std::allocator<unsigned_char>>::
  _M_assign_aux<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
            ((vector<unsigned_char,std::allocator<unsigned_char>> *)obj,
             local_168.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start,
             local_168.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_finish);
  (this->super_CChainParams).consensus.nSubsidyHalvingInterval = 210000;
  (this->super_CChainParams).consensus.BIP34Height = 1;
  puVar1 = &(this->super_CChainParams).consensus.BIP34Hash;
  (puVar1->super_base_blob<256U>).m_data._M_elems[0] = '\0';
  (puVar1->super_base_blob<256U>).m_data._M_elems[1] = '\0';
  (puVar1->super_base_blob<256U>).m_data._M_elems[2] = '\0';
  (puVar1->super_base_blob<256U>).m_data._M_elems[3] = '\0';
  (puVar1->super_base_blob<256U>).m_data._M_elems[4] = '\0';
  (puVar1->super_base_blob<256U>).m_data._M_elems[5] = '\0';
  (puVar1->super_base_blob<256U>).m_data._M_elems[6] = '\0';
  (puVar1->super_base_blob<256U>).m_data._M_elems[7] = '\0';
  pbVar8 = &(this->super_CChainParams).consensus.BIP34Hash.super_base_blob<256U>;
  (pbVar8->m_data)._M_elems[8] = '\0';
  (pbVar8->m_data)._M_elems[9] = '\0';
  (pbVar8->m_data)._M_elems[10] = '\0';
  (pbVar8->m_data)._M_elems[0xb] = '\0';
  (pbVar8->m_data)._M_elems[0xc] = '\0';
  (pbVar8->m_data)._M_elems[0xd] = '\0';
  (pbVar8->m_data)._M_elems[0xe] = '\0';
  (pbVar8->m_data)._M_elems[0xf] = '\0';
  pbVar8 = &(this->super_CChainParams).consensus.BIP34Hash.super_base_blob<256U>;
  (pbVar8->m_data)._M_elems[0x10] = '\0';
  (pbVar8->m_data)._M_elems[0x11] = '\0';
  (pbVar8->m_data)._M_elems[0x12] = '\0';
  (pbVar8->m_data)._M_elems[0x13] = '\0';
  (pbVar8->m_data)._M_elems[0x14] = '\0';
  (pbVar8->m_data)._M_elems[0x15] = '\0';
  (pbVar8->m_data)._M_elems[0x16] = '\0';
  (pbVar8->m_data)._M_elems[0x17] = '\0';
  pbVar8 = &(this->super_CChainParams).consensus.BIP34Hash.super_base_blob<256U>;
  (pbVar8->m_data)._M_elems[0x18] = '\0';
  (pbVar8->m_data)._M_elems[0x19] = '\0';
  (pbVar8->m_data)._M_elems[0x1a] = '\0';
  (pbVar8->m_data)._M_elems[0x1b] = '\0';
  (pbVar8->m_data)._M_elems[0x1c] = '\0';
  (pbVar8->m_data)._M_elems[0x1d] = '\0';
  (pbVar8->m_data)._M_elems[0x1e] = '\0';
  (pbVar8->m_data)._M_elems[0x1f] = '\0';
  (this->super_CChainParams).consensus.BIP65Height = 1;
  (this->super_CChainParams).consensus.BIP66Height = 1;
  (this->super_CChainParams).consensus.CSVHeight = 1;
  (this->super_CChainParams).consensus.SegwitHeight = 1;
  (this->super_CChainParams).consensus.nPowTargetTimespan = 0x127500;
  (this->super_CChainParams).consensus.nPowTargetSpacing = 600;
  puVar1 = &(this->super_CChainParams).consensus.powLimit;
  (puVar1->super_base_blob<256U>).m_data._M_elems[0] = '\0';
  (puVar1->super_base_blob<256U>).m_data._M_elems[1] = '\0';
  (puVar1->super_base_blob<256U>).m_data._M_elems[2] = '\0';
  (puVar1->super_base_blob<256U>).m_data._M_elems[3] = '\0';
  (puVar1->super_base_blob<256U>).m_data._M_elems[4] = '\0';
  (puVar1->super_base_blob<256U>).m_data._M_elems[5] = '\0';
  (puVar1->super_base_blob<256U>).m_data._M_elems[6] = '\0';
  (puVar1->super_base_blob<256U>).m_data._M_elems[7] = '\0';
  pbVar8 = &(this->super_CChainParams).consensus.powLimit.super_base_blob<256U>;
  (pbVar8->m_data)._M_elems[8] = '\0';
  (pbVar8->m_data)._M_elems[9] = '\0';
  (pbVar8->m_data)._M_elems[10] = '\0';
  (pbVar8->m_data)._M_elems[0xb] = '\0';
  (pbVar8->m_data)._M_elems[0xc] = '\0';
  (pbVar8->m_data)._M_elems[0xd] = '\0';
  (pbVar8->m_data)._M_elems[0xe] = '\0';
  (pbVar8->m_data)._M_elems[0xf] = '\0';
  pbVar8 = &(this->super_CChainParams).consensus.powLimit.super_base_blob<256U>;
  (pbVar8->m_data)._M_elems[0xb] = '\0';
  (pbVar8->m_data)._M_elems[0xc] = '\0';
  (pbVar8->m_data)._M_elems[0xd] = '\0';
  (pbVar8->m_data)._M_elems[0xe] = '\0';
  (pbVar8->m_data)._M_elems[0xf] = '\0';
  (pbVar8->m_data)._M_elems[0x10] = '\0';
  (pbVar8->m_data)._M_elems[0x11] = '\0';
  (pbVar8->m_data)._M_elems[0x12] = '\0';
  pbVar8 = &(this->super_CChainParams).consensus.powLimit.super_base_blob<256U>;
  (pbVar8->m_data)._M_elems[0x13] = '\0';
  (pbVar8->m_data)._M_elems[0x14] = '\0';
  (pbVar8->m_data)._M_elems[0x15] = '\0';
  (pbVar8->m_data)._M_elems[0x16] = '\0';
  (pbVar8->m_data)._M_elems[0x17] = '\0';
  (pbVar8->m_data)._M_elems[0x18] = '\0';
  (pbVar8->m_data)._M_elems[0x19] = '\0';
  (pbVar8->m_data)._M_elems[0x1a] = '\0';
  *(undefined8 *)
   ((this->super_CChainParams).consensus.powLimit.super_base_blob<256U>.m_data._M_elems + 0x1b) =
       0x377ae;
  (this->super_CChainParams).consensus.MinBIP9WarningHeight = 0;
  (this->super_CChainParams).consensus.nRuleChangeActivationThreshold = 0x717;
  (this->super_CChainParams).consensus.nMinerConfirmationWindow = 0x7e0;
  (this->super_CChainParams).consensus.vDeployments[0].bit = 0x1c;
  (this->super_CChainParams).consensus.vDeployments[0].nStartTime = -2;
  (this->super_CChainParams).consensus.vDeployments[0].nTimeout = 0x7fffffffffffffff;
  (this->super_CChainParams).consensus.vDeployments[0].min_activation_height = 0;
  (this->super_CChainParams).consensus.vDeployments[1].bit = 2;
  (this->super_CChainParams).consensus.vDeployments[1].nStartTime = -1;
  (this->super_CChainParams).consensus.vDeployments[1].nTimeout = 0x7fffffffffffffff;
  (this->super_CChainParams).consensus.vDeployments[1].min_activation_height = 0;
  h.ctx.buf[0x30] = '\0';
  h.ctx.buf[0x31] = '\0';
  h.ctx.buf[0x32] = '\0';
  h.ctx.buf[0x33] = '\0';
  h.ctx.buf[0x34] = '\0';
  h.ctx.buf[0x35] = '\0';
  h.ctx.buf[0x36] = '\0';
  h.ctx.buf[0x37] = '\0';
  h.ctx.buf[0x38] = '\0';
  h.ctx.buf[0x39] = '\0';
  h.ctx.buf[0x3a] = '\0';
  h.ctx.buf[0x3b] = '\0';
  h.ctx.buf[0x3c] = '\0';
  h.ctx.buf[0x3d] = '\0';
  h.ctx.buf[0x3e] = '\0';
  h.ctx.buf[0x3f] = '\0';
  h.ctx.buf[0x20] = '\0';
  h.ctx.buf[0x21] = '\0';
  h.ctx.buf[0x22] = '\0';
  h.ctx.buf[0x23] = '\0';
  h.ctx.buf[0x24] = '\0';
  h.ctx.buf[0x25] = '\0';
  h.ctx.buf[0x26] = '\0';
  h.ctx.buf[0x27] = '\0';
  h.ctx.buf[0x28] = '\0';
  h.ctx.buf[0x29] = '\0';
  h.ctx.buf[0x2a] = '\0';
  h.ctx.buf[0x2b] = '\0';
  h.ctx.buf[0x2c] = '\0';
  h.ctx.buf[0x2d] = '\0';
  h.ctx.buf[0x2e] = '\0';
  h.ctx.buf[0x2f] = '\0';
  h.ctx.buf[0x10] = '\0';
  h.ctx.buf[0x11] = '\0';
  h.ctx.buf[0x12] = '\0';
  h.ctx.buf[0x13] = '\0';
  h.ctx.buf[0x14] = '\0';
  h.ctx.buf[0x15] = '\0';
  h.ctx.buf[0x16] = '\0';
  h.ctx.buf[0x17] = '\0';
  h.ctx.buf[0x18] = '\0';
  h.ctx.buf[0x19] = '\0';
  h.ctx.buf[0x1a] = '\0';
  h.ctx.buf[0x1b] = '\0';
  h.ctx.buf[0x1c] = '\0';
  h.ctx.buf[0x1d] = '\0';
  h.ctx.buf[0x1e] = '\0';
  h.ctx.buf[0x1f] = '\0';
  h.ctx.buf[0] = '\0';
  h.ctx.buf[1] = '\0';
  h.ctx.buf[2] = '\0';
  h.ctx.buf[3] = '\0';
  h.ctx.buf[4] = '\0';
  h.ctx.buf[5] = '\0';
  h.ctx.buf[6] = '\0';
  h.ctx.buf[7] = '\0';
  h.ctx.buf[8] = '\0';
  h.ctx.buf[9] = '\0';
  h.ctx.buf[10] = '\0';
  h.ctx.buf[0xb] = '\0';
  h.ctx.buf[0xc] = '\0';
  h.ctx.buf[0xd] = '\0';
  h.ctx.buf[0xe] = '\0';
  h.ctx.buf[0xf] = '\0';
  h.ctx.s[4] = 0;
  h.ctx.s[5] = 0;
  h.ctx.s[6] = 0;
  h.ctx.s[7] = 0;
  h.ctx.s[0] = 0;
  h.ctx.s[1] = 0;
  h.ctx.s[2] = 0;
  h.ctx.s[3] = 0;
  h.ctx.bytes = 0;
  CSHA256::CSHA256(&h.ctx);
  HashWriter::operator<<(&h,obj);
  HashWriter::GetHash(&hash,&h);
  *(undefined4 *)(this->super_CChainParams).pchMessageStart._M_elems =
       hash.super_base_blob<256U>.m_data._M_elems._0_4_;
  (this->super_CChainParams).nDefaultPort = 0x95bd;
  (this->super_CChainParams).nPruneAfterHeight = 1000;
  local_170 = 5000000000;
  CreateGenesisBlock((CBlock *)local_128,0x5f4d8f00,0x322d28a,0x1e0377ae,(int32_t)&local_170,in_R9);
  this_01 = &(this->super_CChainParams).genesis;
  puVar13 = (undefined8 *)local_128;
  pCVar14 = this_01;
  for (lVar11 = 10; lVar11 != 0; lVar11 = lVar11 + -1) {
    uVar2 = *puVar13;
    (pCVar14->super_CBlockHeader).nVersion = (int)uVar2;
    (pCVar14->super_CBlockHeader).hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0] =
         (char)((ulong)uVar2 >> 0x20);
    (pCVar14->super_CBlockHeader).hashPrevBlock.super_base_blob<256U>.m_data._M_elems[1] =
         (char)((ulong)uVar2 >> 0x28);
    (pCVar14->super_CBlockHeader).hashPrevBlock.super_base_blob<256U>.m_data._M_elems[2] =
         (char)((ulong)uVar2 >> 0x30);
    (pCVar14->super_CBlockHeader).hashPrevBlock.super_base_blob<256U>.m_data._M_elems[3] =
         (char)((ulong)uVar2 >> 0x38);
    puVar13 = puVar13 + (ulong)bVar15 * -2 + 1;
    pCVar14 = (CBlock *)((long)pCVar14 + (ulong)bVar15 * -0x10 + 8);
  }
  local_148.
  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (this->super_CChainParams).genesis.vtx.
       super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (this->super_CChainParams).genesis.vtx.
  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       local_d8.
       super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_148.
  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (this->super_CChainParams).genesis.vtx.
       super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_148.
  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (this->super_CChainParams).genesis.vtx.
       super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  (this->super_CChainParams).genesis.vtx.
  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       local_d8.
       super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  (this->super_CChainParams).genesis.vtx.
  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       local_d8.
       super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_d8.
  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_d8.
  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_d8.
  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::~vector(&local_148);
  (this->super_CChainParams).genesis.m_checked_merkle_root = local_be;
  (this->super_CChainParams).genesis.fChecked = local_c0;
  (this->super_CChainParams).genesis.m_checked_witness_commitment = bStack_bf;
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::~vector(&local_d8);
  CBlockHeader::GetHash((uint256 *)local_128,&this_01->super_CBlockHeader);
  *(ulong *)((this->super_CChainParams).consensus.hashGenesisBlock.super_base_blob<256U>.m_data.
             _M_elems + 0x10) =
       CONCAT17(local_128[0x17],
                CONCAT16(local_128[0x16],
                         CONCAT15(local_128[0x15],
                                  CONCAT14(local_128[0x14],
                                           CONCAT13(local_128[0x13],
                                                    CONCAT12(local_128[0x12],
                                                             CONCAT11(local_128[0x11],
                                                                      local_128[0x10])))))));
  *(ulong *)((this->super_CChainParams).consensus.hashGenesisBlock.super_base_blob<256U>.m_data.
             _M_elems + 0x18) =
       CONCAT17(local_128[0x1f],
                CONCAT16(local_128[0x1e],
                         CONCAT15(local_128[0x1d],
                                  CONCAT14(local_128[0x1c],
                                           CONCAT13(local_128[0x1b],
                                                    CONCAT12(local_128[0x1a],
                                                             CONCAT11(local_128[0x19],
                                                                      local_128[0x18])))))));
  *(ulong *)(this->super_CChainParams).consensus.hashGenesisBlock.super_base_blob<256U>.m_data.
            _M_elems =
       CONCAT17(local_128[7],
                CONCAT16(local_128[6],
                         CONCAT15(local_128[5],
                                  CONCAT14(local_128[4],
                                           CONCAT13(local_128[3],
                                                    CONCAT12(local_128[2],
                                                             CONCAT11(local_128[1],local_128[0])))))
                        ));
  *(ulong *)((this->super_CChainParams).consensus.hashGenesisBlock.super_base_blob<256U>.m_data.
             _M_elems + 8) =
       CONCAT17(local_128[0xf],
                CONCAT16(local_128[0xe],
                         CONCAT15(local_128[0xd],
                                  CONCAT14(local_128[0xc],
                                           CONCAT13(local_128[0xb],
                                                    CONCAT12(local_128[10],
                                                             CONCAT11(local_128[9],local_128[8])))))
                        ));
  local_128[0] = (vector<unsigned_char,std::allocator<unsigned_char>>)0xf6;
  local_128[1] = '\x1e';
  local_128[2] = 0xee;
  local_128[3] = ';';
  local_128[4] = 'c';
  local_128[5] = 0xa3;
  local_128[6] = 0x80;
  local_128[7] = 0xa4;
  local_128[8] = 'w';
  local_128[9] = 0xa0;
  local_128[10] = 'c';
  local_128[0xb] = 0xaf;
  local_128[0xc] = '2';
  local_128[0xd] = 0xb2;
  local_128[0xe] = 0xbb;
  local_128[0xf] = 0xc9;
  local_128[0x10] = '|';
  local_128[0x11] = -0x61;
  local_128[0x12] = -7;
  local_128[0x13] = -0x10;
  local_128[0x14] = '\x1f';
  local_128[0x15] = ',';
  local_128[0x16] = 'B';
  local_128[0x17] = '%';
  local_128[0x18] = -0x17;
  local_128[0x19] = 's';
  local_128[0x1a] = -0x68;
  local_128[0x1b] = -0x7f;
  local_128[0x1c] = '\b';
  local_128[0x1d] = '\0';
  local_128[0x1e] = '\0';
  local_128[0x1f] = '\0';
  auVar18[0] = -((this->super_CChainParams).consensus.hashGenesisBlock.super_base_blob<256U>.m_data.
                 _M_elems[0x10] == '|');
  auVar18[1] = -((this->super_CChainParams).consensus.hashGenesisBlock.super_base_blob<256U>.m_data.
                 _M_elems[0x11] == 0x9f);
  auVar18[2] = -((this->super_CChainParams).consensus.hashGenesisBlock.super_base_blob<256U>.m_data.
                 _M_elems[0x12] == 0xf9);
  auVar18[3] = -((this->super_CChainParams).consensus.hashGenesisBlock.super_base_blob<256U>.m_data.
                 _M_elems[0x13] == 0xf0);
  auVar18[4] = -((this->super_CChainParams).consensus.hashGenesisBlock.super_base_blob<256U>.m_data.
                 _M_elems[0x14] == '\x1f');
  auVar18[5] = -((this->super_CChainParams).consensus.hashGenesisBlock.super_base_blob<256U>.m_data.
                 _M_elems[0x15] == ',');
  auVar18[6] = -((this->super_CChainParams).consensus.hashGenesisBlock.super_base_blob<256U>.m_data.
                 _M_elems[0x16] == 'B');
  auVar18[7] = -((this->super_CChainParams).consensus.hashGenesisBlock.super_base_blob<256U>.m_data.
                 _M_elems[0x17] == '%');
  auVar18[8] = -((this->super_CChainParams).consensus.hashGenesisBlock.super_base_blob<256U>.m_data.
                 _M_elems[0x18] == 0xe9);
  auVar18[9] = -((this->super_CChainParams).consensus.hashGenesisBlock.super_base_blob<256U>.m_data.
                 _M_elems[0x19] == 's');
  auVar18[10] = -((this->super_CChainParams).consensus.hashGenesisBlock.super_base_blob<256U>.m_data
                  ._M_elems[0x1a] == 0x98);
  auVar18[0xb] = -((this->super_CChainParams).consensus.hashGenesisBlock.super_base_blob<256U>.
                   m_data._M_elems[0x1b] == 0x81);
  auVar18[0xc] = -((this->super_CChainParams).consensus.hashGenesisBlock.super_base_blob<256U>.
                   m_data._M_elems[0x1c] == '\b');
  auVar18[0xd] = -((this->super_CChainParams).consensus.hashGenesisBlock.super_base_blob<256U>.
                   m_data._M_elems[0x1d] == '\0');
  auVar18[0xe] = -((this->super_CChainParams).consensus.hashGenesisBlock.super_base_blob<256U>.
                   m_data._M_elems[0x1e] == '\0');
  auVar18[0xf] = -((this->super_CChainParams).consensus.hashGenesisBlock.super_base_blob<256U>.
                   m_data._M_elems[0x1f] == '\0');
  auVar16[0] = -((this->super_CChainParams).consensus.hashGenesisBlock.super_base_blob<256U>.m_data.
                 _M_elems[0] == 0xf6);
  auVar16[1] = -((this->super_CChainParams).consensus.hashGenesisBlock.super_base_blob<256U>.m_data.
                 _M_elems[1] == '\x1e');
  auVar16[2] = -((this->super_CChainParams).consensus.hashGenesisBlock.super_base_blob<256U>.m_data.
                 _M_elems[2] == 0xee);
  auVar16[3] = -((this->super_CChainParams).consensus.hashGenesisBlock.super_base_blob<256U>.m_data.
                 _M_elems[3] == ';');
  auVar16[4] = -((this->super_CChainParams).consensus.hashGenesisBlock.super_base_blob<256U>.m_data.
                 _M_elems[4] == 'c');
  auVar16[5] = -((this->super_CChainParams).consensus.hashGenesisBlock.super_base_blob<256U>.m_data.
                 _M_elems[5] == 0xa3);
  auVar16[6] = -((this->super_CChainParams).consensus.hashGenesisBlock.super_base_blob<256U>.m_data.
                 _M_elems[6] == 0x80);
  auVar16[7] = -((this->super_CChainParams).consensus.hashGenesisBlock.super_base_blob<256U>.m_data.
                 _M_elems[7] == 0xa4);
  auVar16[8] = -((this->super_CChainParams).consensus.hashGenesisBlock.super_base_blob<256U>.m_data.
                 _M_elems[8] == 'w');
  auVar16[9] = -((this->super_CChainParams).consensus.hashGenesisBlock.super_base_blob<256U>.m_data.
                 _M_elems[9] == 0xa0);
  auVar16[10] = -((this->super_CChainParams).consensus.hashGenesisBlock.super_base_blob<256U>.m_data
                  ._M_elems[10] == 'c');
  auVar16[0xb] = -((this->super_CChainParams).consensus.hashGenesisBlock.super_base_blob<256U>.
                   m_data._M_elems[0xb] == 0xaf);
  auVar16[0xc] = -((this->super_CChainParams).consensus.hashGenesisBlock.super_base_blob<256U>.
                   m_data._M_elems[0xc] == '2');
  auVar16[0xd] = -((this->super_CChainParams).consensus.hashGenesisBlock.super_base_blob<256U>.
                   m_data._M_elems[0xd] == 0xb2);
  auVar16[0xe] = -((this->super_CChainParams).consensus.hashGenesisBlock.super_base_blob<256U>.
                   m_data._M_elems[0xe] == 0xbb);
  auVar16[0xf] = -((this->super_CChainParams).consensus.hashGenesisBlock.super_base_blob<256U>.
                   m_data._M_elems[0xf] == 0xc9);
  auVar16 = auVar16 & auVar18;
  if ((ushort)((ushort)(SUB161(auVar16 >> 7,0) & 1) | (ushort)(SUB161(auVar16 >> 0xf,0) & 1) << 1 |
               (ushort)(SUB161(auVar16 >> 0x17,0) & 1) << 2 |
               (ushort)(SUB161(auVar16 >> 0x1f,0) & 1) << 3 |
               (ushort)(SUB161(auVar16 >> 0x27,0) & 1) << 4 |
               (ushort)(SUB161(auVar16 >> 0x2f,0) & 1) << 5 |
               (ushort)(SUB161(auVar16 >> 0x37,0) & 1) << 6 |
               (ushort)(SUB161(auVar16 >> 0x3f,0) & 1) << 7 |
               (ushort)(SUB161(auVar16 >> 0x47,0) & 1) << 8 |
               (ushort)(SUB161(auVar16 >> 0x4f,0) & 1) << 9 |
               (ushort)(SUB161(auVar16 >> 0x57,0) & 1) << 10 |
               (ushort)(SUB161(auVar16 >> 0x5f,0) & 1) << 0xb |
               (ushort)(SUB161(auVar16 >> 0x67,0) & 1) << 0xc |
               (ushort)(SUB161(auVar16 >> 0x6f,0) & 1) << 0xd |
               (ushort)(SUB161(auVar16 >> 0x77,0) & 1) << 0xe |
              (ushort)(byte)(auVar16[0xf] >> 7) << 0xf) != 0xffff) {
    __assert_fail("consensus.hashGenesisBlock == uint256{\"00000008819873e925422c1ff0f99f7cc9bbb232af63a077a480a3633bee1ef6\"}"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/kernel/chainparams.cpp"
                  ,0x1ee,"SigNetParams::SigNetParams(const SigNetOptions &)");
  }
  local_128[0] = (vector<unsigned_char,std::allocator<unsigned_char>>)0x3b;
  local_128[1] = 0xa3;
  local_128[2] = 0xed;
  local_128[3] = 0xfd;
  local_128[4] = 'z';
  local_128[5] = '{';
  local_128[6] = '\x12';
  local_128[7] = 0xb2;
  local_128[8] = 'z';
  local_128[9] = 199;
  local_128[10] = ',';
  local_128[0xb] = '>';
  local_128[0xc] = 'g';
  local_128[0xd] = 'v';
  local_128[0xe] = 0x8f;
  local_128[0xf] = 'a';
  local_128[0x10] = DAT_01105b60;
  local_128[0x11] = DAT_01105b60._1_1_;
  local_128[0x12] = DAT_01105b60._2_1_;
  local_128[0x13] = DAT_01105b60._3_1_;
  local_128[0x14] = DAT_01105b60._4_1_;
  local_128[0x15] = DAT_01105b60._5_1_;
  local_128[0x16] = DAT_01105b60._6_1_;
  local_128[0x17] = DAT_01105b60._7_1_;
  local_128[0x18] = DAT_01105b60._8_1_;
  local_128[0x19] = DAT_01105b60._9_1_;
  local_128[0x1a] = DAT_01105b60._10_1_;
  local_128[0x1b] = DAT_01105b60._11_1_;
  local_128[0x1c] = DAT_01105b60._12_1_;
  local_128[0x1d] = DAT_01105b60._13_1_;
  local_128[0x1e] = DAT_01105b60._14_1_;
  local_128[0x1f] = DAT_01105b60._15_1_;
  auVar19[0] = -(*(uchar *)((long)(this->super_CChainParams).genesis.super_CBlockHeader.
                                  hashMerkleRoot.super_base_blob<256U>.m_data._M_elems + 0x10) ==
                local_128[0x10]);
  auVar19[1] = -(*(uchar *)((long)(this->super_CChainParams).genesis.super_CBlockHeader.
                                  hashMerkleRoot.super_base_blob<256U>.m_data._M_elems + 0x11) ==
                local_128[0x11]);
  auVar19[2] = -(*(uchar *)((long)(this->super_CChainParams).genesis.super_CBlockHeader.
                                  hashMerkleRoot.super_base_blob<256U>.m_data._M_elems + 0x12) ==
                local_128[0x12]);
  auVar19[3] = -(*(uchar *)((long)(this->super_CChainParams).genesis.super_CBlockHeader.
                                  hashMerkleRoot.super_base_blob<256U>.m_data._M_elems + 0x13) ==
                local_128[0x13]);
  auVar19[4] = -(*(uchar *)((long)(this->super_CChainParams).genesis.super_CBlockHeader.
                                  hashMerkleRoot.super_base_blob<256U>.m_data._M_elems + 0x14) ==
                local_128[0x14]);
  auVar19[5] = -(*(uchar *)((long)(this->super_CChainParams).genesis.super_CBlockHeader.
                                  hashMerkleRoot.super_base_blob<256U>.m_data._M_elems + 0x15) ==
                local_128[0x15]);
  auVar19[6] = -(*(uchar *)((long)(this->super_CChainParams).genesis.super_CBlockHeader.
                                  hashMerkleRoot.super_base_blob<256U>.m_data._M_elems + 0x16) ==
                local_128[0x16]);
  auVar19[7] = -(*(uchar *)((long)(this->super_CChainParams).genesis.super_CBlockHeader.
                                  hashMerkleRoot.super_base_blob<256U>.m_data._M_elems + 0x17) ==
                local_128[0x17]);
  auVar19[8] = -(*(uchar *)((long)(this->super_CChainParams).genesis.super_CBlockHeader.
                                  hashMerkleRoot.super_base_blob<256U>.m_data._M_elems + 0x18) ==
                local_128[0x18]);
  auVar19[9] = -(*(uchar *)((long)(this->super_CChainParams).genesis.super_CBlockHeader.
                                  hashMerkleRoot.super_base_blob<256U>.m_data._M_elems + 0x19) ==
                local_128[0x19]);
  auVar19[10] = -(*(uchar *)((long)(this->super_CChainParams).genesis.super_CBlockHeader.
                                   hashMerkleRoot.super_base_blob<256U>.m_data._M_elems + 0x1a) ==
                 local_128[0x1a]);
  auVar19[0xb] = -(*(uchar *)((long)(this->super_CChainParams).genesis.super_CBlockHeader.
                                    hashMerkleRoot.super_base_blob<256U>.m_data._M_elems + 0x1b) ==
                  local_128[0x1b]);
  auVar19[0xc] = -(*(uchar *)((long)(this->super_CChainParams).genesis.super_CBlockHeader.
                                    hashMerkleRoot.super_base_blob<256U>.m_data._M_elems + 0x1c) ==
                  local_128[0x1c]);
  auVar19[0xd] = -(*(uchar *)((long)(this->super_CChainParams).genesis.super_CBlockHeader.
                                    hashMerkleRoot.super_base_blob<256U>.m_data._M_elems + 0x1d) ==
                  local_128[0x1d]);
  auVar19[0xe] = -(*(uchar *)((long)(this->super_CChainParams).genesis.super_CBlockHeader.
                                    hashMerkleRoot.super_base_blob<256U>.m_data._M_elems + 0x1e) ==
                  local_128[0x1e]);
  auVar19[0xf] = -(*(uchar *)((long)(this->super_CChainParams).genesis.super_CBlockHeader.
                                    hashMerkleRoot.super_base_blob<256U>.m_data._M_elems + 0x1f) ==
                  local_128[0x1f]);
  auVar17[0] = -((this->super_CChainParams).genesis.super_CBlockHeader.hashMerkleRoot.
                 super_base_blob<256U>.m_data._M_elems[0] == ';');
  auVar17[1] = -(*(uchar *)((long)(this->super_CChainParams).genesis.super_CBlockHeader.
                                  hashMerkleRoot.super_base_blob<256U>.m_data._M_elems + 1) == 0xa3)
  ;
  auVar17[2] = -(*(uchar *)((long)(this->super_CChainParams).genesis.super_CBlockHeader.
                                  hashMerkleRoot.super_base_blob<256U>.m_data._M_elems + 2) == 0xed)
  ;
  auVar17[3] = -(*(uchar *)((long)(this->super_CChainParams).genesis.super_CBlockHeader.
                                  hashMerkleRoot.super_base_blob<256U>.m_data._M_elems + 3) == 0xfd)
  ;
  auVar17[4] = -(*(uchar *)((long)(this->super_CChainParams).genesis.super_CBlockHeader.
                                  hashMerkleRoot.super_base_blob<256U>.m_data._M_elems + 4) == 'z');
  auVar17[5] = -(*(uchar *)((long)(this->super_CChainParams).genesis.super_CBlockHeader.
                                  hashMerkleRoot.super_base_blob<256U>.m_data._M_elems + 5) == '{');
  auVar17[6] = -(*(uchar *)((long)(this->super_CChainParams).genesis.super_CBlockHeader.
                                  hashMerkleRoot.super_base_blob<256U>.m_data._M_elems + 6) ==
                '\x12');
  auVar17[7] = -(*(uchar *)((long)(this->super_CChainParams).genesis.super_CBlockHeader.
                                  hashMerkleRoot.super_base_blob<256U>.m_data._M_elems + 7) == 0xb2)
  ;
  auVar17[8] = -(*(uchar *)((long)(this->super_CChainParams).genesis.super_CBlockHeader.
                                  hashMerkleRoot.super_base_blob<256U>.m_data._M_elems + 8) == 'z');
  auVar17[9] = -(*(uchar *)((long)(this->super_CChainParams).genesis.super_CBlockHeader.
                                  hashMerkleRoot.super_base_blob<256U>.m_data._M_elems + 9) == 199);
  auVar17[10] = -(*(uchar *)((long)(this->super_CChainParams).genesis.super_CBlockHeader.
                                   hashMerkleRoot.super_base_blob<256U>.m_data._M_elems + 10) == ','
                 );
  auVar17[0xb] = -(*(uchar *)((long)(this->super_CChainParams).genesis.super_CBlockHeader.
                                    hashMerkleRoot.super_base_blob<256U>.m_data._M_elems + 0xb) ==
                  '>');
  auVar17[0xc] = -(*(uchar *)((long)(this->super_CChainParams).genesis.super_CBlockHeader.
                                    hashMerkleRoot.super_base_blob<256U>.m_data._M_elems + 0xc) ==
                  'g');
  auVar17[0xd] = -(*(uchar *)((long)(this->super_CChainParams).genesis.super_CBlockHeader.
                                    hashMerkleRoot.super_base_blob<256U>.m_data._M_elems + 0xd) ==
                  'v');
  auVar17[0xe] = -(*(uchar *)((long)(this->super_CChainParams).genesis.super_CBlockHeader.
                                    hashMerkleRoot.super_base_blob<256U>.m_data._M_elems + 0xe) ==
                  0x8f);
  auVar17[0xf] = -(*(uchar *)((long)(this->super_CChainParams).genesis.super_CBlockHeader.
                                    hashMerkleRoot.super_base_blob<256U>.m_data._M_elems + 0xf) ==
                  'a');
  auVar17 = auVar17 & auVar19;
  if ((ushort)((ushort)(SUB161(auVar17 >> 7,0) & 1) | (ushort)(SUB161(auVar17 >> 0xf,0) & 1) << 1 |
               (ushort)(SUB161(auVar17 >> 0x17,0) & 1) << 2 |
               (ushort)(SUB161(auVar17 >> 0x1f,0) & 1) << 3 |
               (ushort)(SUB161(auVar17 >> 0x27,0) & 1) << 4 |
               (ushort)(SUB161(auVar17 >> 0x2f,0) & 1) << 5 |
               (ushort)(SUB161(auVar17 >> 0x37,0) & 1) << 6 |
               (ushort)(SUB161(auVar17 >> 0x3f,0) & 1) << 7 |
               (ushort)(SUB161(auVar17 >> 0x47,0) & 1) << 8 |
               (ushort)(SUB161(auVar17 >> 0x4f,0) & 1) << 9 |
               (ushort)(SUB161(auVar17 >> 0x57,0) & 1) << 10 |
               (ushort)(SUB161(auVar17 >> 0x5f,0) & 1) << 0xb |
               (ushort)(SUB161(auVar17 >> 0x67,0) & 1) << 0xc |
               (ushort)(SUB161(auVar17 >> 0x6f,0) & 1) << 0xd |
               (ushort)(SUB161(auVar17 >> 0x77,0) & 1) << 0xe |
              (ushort)(byte)(auVar17[0xf] >> 7) << 0xf) != 0xffff) {
    __assert_fail("genesis.hashMerkleRoot == uint256{\"4a5e1e4baab89f3a32518a88c31bc87f618f76673e2cc77ab2127b7afdeda33b\"}"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/kernel/chainparams.cpp"
                  ,0x1ef,"SigNetParams::SigNetParams(const SigNetOptions &)");
  }
  puVar4 = (this->super_CChainParams).vFixedSeeds.
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->super_CChainParams).vFixedSeeds.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish != puVar4) {
    (this->super_CChainParams).vFixedSeeds.
    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = puVar4;
  }
  local_128[0] = (vector<unsigned_char,std::allocator<unsigned_char>>)0x0;
  local_128[1] = 'q';
  local_128[2] = '\x02';
  local_128[3] = '\0';
  local_128[4] = 0x8a;
  local_128[5] = 0x92;
  local_128[6] = 0xdf;
  local_128[7] = 0xdb;
  local_128[8] = 0x83;
  local_128[9] = '\a';
  local_128[10] = 0xd7;
  local_128[0xb] = 0xb7;
  local_128[0xc] = 'Y';
  local_128[0xd] = 0x9b;
  local_128[0xe] = 0x8c;
  local_128[0xf] = '0';
  local_128[0x10] = '\v';
  local_128[0x11] = -0x31;
  local_128[0x12] = -0x34;
  local_128[0x13] = '\x1b';
  local_128[0x14] = '\"';
  local_128[0x15] = -0x3a;
  local_128[0x16] = '\x19';
  local_128[0x17] = -0x4c;
  local_128[0x18] = 'l';
  local_128[0x19] = '$';
  local_128[0x1a] = '=';
  local_128[0x1b] = -0x78;
  local_128[0x1c] = -0x4b;
  local_128[0x1d] = -0x2a;
  local_128[0x1e] = 't';
  local_128[0x1f] = -0x65;
  auStack_108[0] = '0';
  auStack_108[1] = 'D';
  auStack_108[2] = '\n';
  auStack_108[3] = 0xfe;
  local_100[0] = 'X';
  local_100[1] = 0xef;
  local_100[2] = '\"';
  local_100[3] = '\0';
  local_100[4] = '\0';
  local_100[5] = '\0';
  local_100[6] = '\0';
  local_100[7] = '\0';
  local_100[8] = ',';
  local_100[9] = 0xa6;
  local_100[10] = 'S';
  local_100[0xb] = '\x03';
  local_100[0xc] = 0xf9;
  local_100[0xd] = '\x1e';
  local_100[0xe] = 0xaf;
  local_100[0xf] = 0xcf;
  local_100[0x10] = 0x95;
  local_100[0x11] = '\b';
  local_100[0x12] = 0x8f;
  local_100[0x13] = 'k';
  local_100[0x14] = 0xfd;
  local_100[0x15] = 0xd0;
  local_100[0x16] = 0x8b;
  local_100[0x17] = 200;
  local_100._24_8_ = 0x40f2563c2ad8f8e;
  local_100._32_8_ = 0x3ca3c99aff;
  std::vector<AssumeutxoData,std::allocator<AssumeutxoData>>::_M_assign_aux<AssumeutxoData_const*>
            ((vector<AssumeutxoData,std::allocator<AssumeutxoData>> *)
             &(this->super_CChainParams).m_assumeutxo_data,local_128);
  puVar10 = (pointer)operator_new(1);
  *puVar10 = 'o';
  puVar4 = (this->super_CChainParams).base58Prefixes[0].
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  puVar5 = (this->super_CChainParams).base58Prefixes[0].
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
  (this->super_CChainParams).base58Prefixes[0].
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_start = puVar10;
  (this->super_CChainParams).base58Prefixes[0].
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_finish = puVar10 + 1;
  (this->super_CChainParams).base58Prefixes[0].
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = puVar10 + 1;
  if (puVar4 != (pointer)0x0) {
    operator_delete(puVar4,(long)puVar5 - (long)puVar4);
  }
  puVar10 = (pointer)operator_new(1);
  *puVar10 = 0xc4;
  puVar4 = (this->super_CChainParams).base58Prefixes[1].
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  puVar5 = (this->super_CChainParams).base58Prefixes[1].
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
  (this->super_CChainParams).base58Prefixes[1].
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_start = puVar10;
  (this->super_CChainParams).base58Prefixes[1].
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_finish = puVar10 + 1;
  (this->super_CChainParams).base58Prefixes[1].
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = puVar10 + 1;
  if (puVar4 != (pointer)0x0) {
    operator_delete(puVar4,(long)puVar5 - (long)puVar4);
  }
  puVar10 = (pointer)operator_new(1);
  *puVar10 = 0xef;
  puVar4 = (this->super_CChainParams).base58Prefixes[2].
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  puVar5 = (this->super_CChainParams).base58Prefixes[2].
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
  (this->super_CChainParams).base58Prefixes[2].
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_start = puVar10;
  (this->super_CChainParams).base58Prefixes[2].
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_finish = puVar10 + 1;
  (this->super_CChainParams).base58Prefixes[2].
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = puVar10 + 1;
  if (puVar4 != (pointer)0x0) {
    operator_delete(puVar4,(long)puVar5 - (long)puVar4);
  }
  local_128[0] = (vector<unsigned_char,std::allocator<unsigned_char>>)0x4;
  local_128[1] = '5';
  local_128[2] = 0x87;
  local_128[3] = 0xcf;
  std::vector<unsigned_char,std::allocator<unsigned_char>>::_M_assign_aux<unsigned_char_const*>
            ((vector<unsigned_char,std::allocator<unsigned_char>> *)
             ((this->super_CChainParams).base58Prefixes + 3),local_128);
  local_128[0] = (vector<unsigned_char,std::allocator<unsigned_char>>)0x4;
  local_128[1] = '5';
  local_128[2] = 0x83;
  local_128[3] = 0x94;
  std::vector<unsigned_char,std::allocator<unsigned_char>>::_M_assign_aux<unsigned_char_const*>
            ((vector<unsigned_char,std::allocator<unsigned_char>> *)
             ((this->super_CChainParams).base58Prefixes + 4));
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
            (&(this->super_CChainParams).bech32_hrp,0,
             (this->super_CChainParams).bech32_hrp._M_string_length,"tb",2);
  (this->super_CChainParams).fDefaultConsistencyChecks = false;
  (this->super_CChainParams).m_is_mockable_chain = false;
  if (local_168.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (uchar *)0x0) {
    operator_delete(local_168.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_168.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_168.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar3) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

explicit SigNetParams(const SigNetOptions& options)
    {
        std::vector<uint8_t> bin;
        vSeeds.clear();

        if (!options.challenge) {
            bin = "512103ad5e0edad18cb1f0fc0d28a3d4f1f3e445640337489abb10404f2d1e086be430210359ef5021964fe22d6f8e05b2463c9540ce96883fe3b278760f048f5189f2e6c452ae"_hex_v_u8;
            vSeeds.emplace_back("seed.signet.bitcoin.sprovoost.nl.");
            vSeeds.emplace_back("seed.signet.achownodes.xyz."); // Ava Chow, only supports x1, x5, x9, x49, x809, x849, xd, x400, x404, x408, x448, xc08, xc48, x40c

            // Hardcoded nodes can be removed once there are more DNS seeds
            vSeeds.emplace_back("178.128.221.177");
            vSeeds.emplace_back("v7ajjeirttkbnt32wpy3c6w3emwnfr3fkla7hpxcfokr3ysd3kqtzmqd.onion:38333");

            consensus.nMinimumChainWork = uint256{"0000000000000000000000000000000000000000000000000000025dbd66e58f"};
            consensus.defaultAssumeValid = uint256{"0000014aad1d58dddcb964dd749b073374c6306e716b22f573a2efe68d414539"}; // 208800
            m_assumed_blockchain_size = 2;
            m_assumed_chain_state_size = 0;
            chainTxData = ChainTxData{
                // Data from RPC: getchaintxstats 4096 0000014aad1d58dddcb964dd749b073374c6306e716b22f573a2efe68d414539
                .nTime    = 1723655233,
                .tx_count = 5507045,
                .dTxRate  = 0.06271073277261494,
            };
        } else {
            bin = *options.challenge;
            consensus.nMinimumChainWork = uint256{};
            consensus.defaultAssumeValid = uint256{};
            m_assumed_blockchain_size = 0;
            m_assumed_chain_state_size = 0;
            chainTxData = ChainTxData{
                0,
                0,
                0,
            };
            LogPrintf("Signet with challenge %s\n", HexStr(bin));
        }

        if (options.seeds) {
            vSeeds = *options.seeds;
        }

        m_chain_type = ChainType::SIGNET;
        consensus.signet_blocks = true;
        consensus.signet_challenge.assign(bin.begin(), bin.end());
        consensus.nSubsidyHalvingInterval = 210000;
        consensus.BIP34Height = 1;
        consensus.BIP34Hash = uint256{};
        consensus.BIP65Height = 1;
        consensus.BIP66Height = 1;
        consensus.CSVHeight = 1;
        consensus.SegwitHeight = 1;
        consensus.nPowTargetTimespan = 14 * 24 * 60 * 60; // two weeks
        consensus.nPowTargetSpacing = 10 * 60;
        consensus.fPowAllowMinDifficultyBlocks = false;
        consensus.enforce_BIP94 = false;
        consensus.fPowNoRetargeting = false;
        consensus.nRuleChangeActivationThreshold = 1815; // 90% of 2016
        consensus.nMinerConfirmationWindow = 2016; // nPowTargetTimespan / nPowTargetSpacing
        consensus.MinBIP9WarningHeight = 0;
        consensus.powLimit = uint256{"00000377ae000000000000000000000000000000000000000000000000000000"};
        consensus.vDeployments[Consensus::DEPLOYMENT_TESTDUMMY].bit = 28;
        consensus.vDeployments[Consensus::DEPLOYMENT_TESTDUMMY].nStartTime = Consensus::BIP9Deployment::NEVER_ACTIVE;
        consensus.vDeployments[Consensus::DEPLOYMENT_TESTDUMMY].nTimeout = Consensus::BIP9Deployment::NO_TIMEOUT;
        consensus.vDeployments[Consensus::DEPLOYMENT_TESTDUMMY].min_activation_height = 0; // No activation delay

        // Activation of Taproot (BIPs 340-342)
        consensus.vDeployments[Consensus::DEPLOYMENT_TAPROOT].bit = 2;
        consensus.vDeployments[Consensus::DEPLOYMENT_TAPROOT].nStartTime = Consensus::BIP9Deployment::ALWAYS_ACTIVE;
        consensus.vDeployments[Consensus::DEPLOYMENT_TAPROOT].nTimeout = Consensus::BIP9Deployment::NO_TIMEOUT;
        consensus.vDeployments[Consensus::DEPLOYMENT_TAPROOT].min_activation_height = 0; // No activation delay

        // message start is defined as the first 4 bytes of the sha256d of the block script
        HashWriter h{};
        h << consensus.signet_challenge;
        uint256 hash = h.GetHash();
        std::copy_n(hash.begin(), 4, pchMessageStart.begin());

        nDefaultPort = 38333;
        nPruneAfterHeight = 1000;

        genesis = CreateGenesisBlock(1598918400, 52613770, 0x1e0377ae, 1, 50 * COIN);
        consensus.hashGenesisBlock = genesis.GetHash();
        assert(consensus.hashGenesisBlock == uint256{"00000008819873e925422c1ff0f99f7cc9bbb232af63a077a480a3633bee1ef6"});
        assert(genesis.hashMerkleRoot == uint256{"4a5e1e4baab89f3a32518a88c31bc87f618f76673e2cc77ab2127b7afdeda33b"});

        vFixedSeeds.clear();

        m_assumeutxo_data = {
            {
                .height = 160'000,
                .hash_serialized = AssumeutxoHash{uint256{"fe0a44309b74d6b5883d246cb419c6221bcccf0b308c9b59b7d70783dbdf928a"}},
                .m_chain_tx_count = 2289496,
                .blockhash = consteval_ctor(uint256{"0000003ca3c99aff040f2563c2ad8f8ec88bd0fd6b8f0895cfaf1ef90353a62c"}),
            }
        };

        base58Prefixes[PUBKEY_ADDRESS] = std::vector<unsigned char>(1,111);
        base58Prefixes[SCRIPT_ADDRESS] = std::vector<unsigned char>(1,196);
        base58Prefixes[SECRET_KEY] =     std::vector<unsigned char>(1,239);
        base58Prefixes[EXT_PUBLIC_KEY] = {0x04, 0x35, 0x87, 0xCF};
        base58Prefixes[EXT_SECRET_KEY] = {0x04, 0x35, 0x83, 0x94};

        bech32_hrp = "tb";

        fDefaultConsistencyChecks = false;
        m_is_mockable_chain = false;
    }